

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

uint64_t read_hex(char **ptr)

{
  uint64_t uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  lVar3 = 0;
  pcVar2 = *ptr + -1;
  uVar1 = 0;
  while( true ) {
    iVar4 = (int)pcVar2[1];
    uVar5 = iVar4 - 0x37;
    if (5 < iVar4 - 0x41U) {
      uVar5 = 0xffffffff;
    }
    if (iVar4 - 0x30U < 10) {
      uVar5 = iVar4 - 0x30U;
    }
    if ((int)uVar5 < 0) break;
    if (uVar1 >> 0x3c != 0) {
      __assert_fail("(res >> 60) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x854,"uint64_t read_hex(const char **)");
    }
    pcVar2 = pcVar2 + 1;
    lVar3 = lVar3 + -1;
    uVar1 = uVar1 * 0x10 + (ulong)uVar5;
  }
  if (lVar3 != 0) {
    *ptr = pcVar2;
    return uVar1;
  }
  __assert_fail("p != *ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x857,"uint64_t read_hex(const char **)");
}

Assistant:

static uint64_t read_hex (const char **ptr) {
  int v;
  const char *p;
  uint64_t res = 0;

  for (p = *ptr; (v = hex_value (*p)) >= 0; p++) {
    gen_assert ((res >> 60) == 0);
    res = res * 16 + v;
  }
  gen_assert (p != *ptr);
  *ptr = p - 1;
  return res;
}